

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

pair<double,_int> Min(vector<double,_std::allocator<double>_> *a)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  pair<double,_int> pVar7;
  
  pdVar2 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    dVar6 = 100000000.0;
    uVar5 = 0;
    uVar3 = 0;
    do {
      dVar1 = pdVar2[uVar5];
      if (dVar1 < dVar6) {
        uVar3 = uVar5 & 0xffffffff;
        dVar6 = dVar1;
      }
      uVar5 = uVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
    pVar7._8_8_ = uVar3;
    pVar7.first = dVar6;
    return pVar7;
  }
  return (pair<double,_int>)ZEXT816(0x4197d78400000000);
}

Assistant:

pair<double, int> Min(const vector<double>& a) {
    double smallest = 1e+8;
    int smIdx = 0;
    for(int i=0; i<a.size(); i++){
        if(a[i] < smallest){
            smallest = a[i];
            smIdx = i;
        }
    }
    return pair<double, int>(smallest, smIdx);
}